

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O3

PlainObject * __thiscall Eigen::ProductBase::operator_cast_to_Matrix_(ProductBase *this)

{
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Scalar local_38 [2];
  undefined8 local_28;
  
  SVar1 = *(Scalar *)(*(long *)this + 8);
  if ((long)SVar1 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  this_00 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(this + 0x10);
  if (*(Scalar *)(this + 0x18) != SVar1) {
    free(*(void **)this_00);
    if (SVar1 == 0.0) {
      pvVar4 = (void *)0x0;
    }
    else {
      if ((ulong)SVar1 >> 0x3d != 0) {
LAB_0010a5f2:
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar4 = malloc((long)SVar1 * 8);
      if (pvVar4 == (void *)0x0) goto LAB_0010a5f2;
    }
    *(void **)this_00 = pvVar4;
  }
  *(Scalar *)(this + 0x18) = SVar1;
  local_28 = 0;
  local_38[0] = SVar1;
  PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (this_00,(EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_38);
  SVar1 = *(Scalar *)(this + 0x18);
  if (SVar1 == local_38[0]) {
    uVar6 = (long)SVar1 - ((long)SVar1 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)SVar1) {
      lVar8 = 0;
      do {
        puVar5 = (undefined8 *)(*(long *)this_00 + lVar8 * 8);
        *puVar5 = local_28;
        puVar5[1] = local_28;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar6);
    }
    auVar3 = _DAT_00112aa0;
    auVar2 = _DAT_00112a90;
    lVar8 = (long)SVar1 % 2;
    if (lVar8 != 0 && (long)uVar6 <= (long)SVar1) {
      lVar7 = lVar8 + -1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = ((long)SVar1 / 2) * 0x10 + *(long *)this_00;
      uVar6 = 0;
      auVar9 = auVar9 ^ _DAT_00112aa0;
      do {
        auVar10._8_4_ = (int)uVar6;
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = (int)(uVar6 >> 0x20);
        auVar10 = (auVar10 | auVar2) ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                    auVar9._4_4_ < auVar10._4_4_) & 1)) {
          *(undefined8 *)(lVar7 + uVar6 * 8) = local_28;
        }
        if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
            auVar10._12_4_ <= auVar9._12_4_) {
          *(undefined8 *)(lVar7 + 8 + uVar6 * 8) = local_28;
        }
        uVar6 = uVar6 + 2;
      } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar6);
    }
    local_38[0] = 1.0;
    GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,4>::
    scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>
                *)this,(Matrix<double,__1,_1,_0,__1,_1> *)this_00,local_38);
    return (PlainObject *)this_00;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

operator const PlainObject& () const
    {
      m_result.resize(m_lhs.rows(), m_rhs.cols());
      derived().evalTo(m_result);
      return m_result;
    }